

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_52317d::X509Test_CommonNameAndNameConstraints_Test::TestBody
          (X509Test_CommonNameAndNameConstraints_Test *this)

{
  initializer_list<x509_st_*> __l;
  initializer_list<x509_st_*> __l_00;
  initializer_list<x509_st_*> __l_01;
  initializer_list<x509_st_*> __l_02;
  initializer_list<x509_st_*> __l_03;
  initializer_list<x509_st_*> __l_04;
  bool bVar1;
  char *pcVar2;
  pointer pxVar3;
  char *in_R9;
  AssertHelper local_500;
  Message local_4f8;
  int local_4f0 [2];
  undefined1 local_4e8 [8];
  AssertionResult gtest_ar_6;
  Message local_4d0;
  function<void_(x509_store_ctx_st_*)> local_4c8;
  vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_> local_4a8;
  allocator<x509_st_*> local_481;
  pointer local_480;
  iterator local_478;
  size_type local_470;
  vector<x509_st_*,_std::allocator<x509_st_*>_> local_468;
  allocator<x509_st_*> local_449;
  pointer local_448;
  iterator local_440;
  size_type local_438;
  vector<x509_st_*,_std::allocator<x509_st_*>_> local_430;
  int local_418 [2];
  undefined1 local_410 [8];
  AssertionResult gtest_ar_5;
  Message local_3f8;
  int local_3f0 [2];
  undefined1 local_3e8 [8];
  AssertionResult gtest_ar_4;
  Message local_3d0;
  function<void_(x509_store_ctx_st_*)> local_3c8;
  vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_> local_3a8;
  allocator<x509_st_*> local_389;
  pointer local_388;
  iterator local_380;
  size_type local_378;
  vector<x509_st_*,_std::allocator<x509_st_*>_> local_370;
  allocator<x509_st_*> local_351;
  pointer local_350;
  iterator local_348;
  size_type local_340;
  vector<x509_st_*,_std::allocator<x509_st_*>_> local_338;
  int local_320 [2];
  undefined1 local_318 [8];
  AssertionResult gtest_ar_3;
  Message local_300;
  function<void_(x509_store_ctx_st_*)> local_2f8;
  vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_> local_2d8;
  allocator<x509_st_*> local_2b9;
  pointer local_2b8;
  iterator local_2b0;
  size_type local_2a8;
  vector<x509_st_*,_std::allocator<x509_st_*>_> local_2a0;
  allocator<x509_st_*> local_281;
  pointer local_280;
  iterator local_278;
  size_type local_270;
  vector<x509_st_*,_std::allocator<x509_st_*>_> local_268;
  int local_250 [2];
  undefined1 local_248 [8];
  AssertionResult gtest_ar_2;
  Message local_230;
  int local_228 [2];
  undefined1 local_220 [8];
  AssertionResult gtest_ar_1;
  Message local_208;
  int local_200 [2];
  undefined1 local_1f8 [8];
  AssertionResult gtest_ar;
  anon_class_16_2_a4d0f9f0 verify_cert;
  AssertHelper local_1b8;
  Message local_1b0;
  undefined1 local_1a8 [8];
  AssertionResult gtest_ar__5;
  UniquePtr<X509> not_dns;
  AssertHelper local_170;
  Message local_168;
  undefined1 local_160 [8];
  AssertionResult gtest_ar__4;
  UniquePtr<X509> not_permitted_with_sans;
  AssertHelper local_128;
  Message local_120;
  undefined1 local_118 [8];
  AssertionResult gtest_ar__3;
  UniquePtr<X509> not_permitted;
  AssertHelper local_e0;
  Message local_d8;
  undefined1 local_d0 [8];
  AssertionResult gtest_ar__2;
  UniquePtr<X509> permitted;
  AssertHelper local_98;
  Message local_90;
  undefined1 local_88 [8];
  AssertionResult gtest_ar__1;
  UniquePtr<X509> intermediate;
  string local_68;
  AssertHelper local_48;
  Message local_40 [3];
  undefined1 local_28 [8];
  AssertionResult gtest_ar_;
  UniquePtr<X509> root;
  X509Test_CommonNameAndNameConstraints_Test *this_local;
  
  CertFromPEM((anon_unknown_dwarf_52317d *)&gtest_ar_.message_,
              "\n-----BEGIN CERTIFICATE-----\nMIICTTCCAbagAwIBAgIIAj5CwoHlWuYwDQYJKoZIhvcNAQELBQAwKzEXMBUGA1UE\nChMOQm9yaW5nU1NMIFRlc3QxEDAOBgNVBAMTB1Jvb3QgQ0EwHhcNMTUwMTAxMDAw\nMDAwWhcNMjUwMTAxMDAwMDAwWjArMRcwFQYDVQQKEw5Cb3JpbmdTU0wgVGVzdDEQ\nMA4GA1UEAxMHUm9vdCBDQTCBnzANBgkqhkiG9w0BAQEFAAOBjQAwgYkCgYEA6Q5/\nEQzmWuaGg3D2UQcuAngR9bIkkjjuJmICx5TxPqF3asCP1SJotl3iTNrghRE1wpJy\nSY2BtIiXa7f8skRb2U0GcPkMxo/ps9+jaoRsQ1m+nbLQdpvD1/qZWcO45fNTA71J\n1rPMokP+rcILuQG4VimUAySnDSghKamulFtK+Z8CAwEAAaN6MHgwDgYDVR0PAQH/\nBAQDAgIEMB0GA1UdJQQWMBQGCCsGAQUFBwMBBggrBgEFBQcDAjAPBgNVHRMBAf8E\nBTADAQH/MBkGA1UdDgQSBBBAN9cB+0AvuBx+VAQnjFkBMBsGA1UdIwQUMBKAEEA3\n1wH7QC+4HH5UBCeMWQEwDQYJKoZIhvcNAQELBQADgYEAc4N6hTE62/3gwg+kyc2f\nc/Jj1mHrOt+0NRaBnmvbmNpsEjHS96Ef4Wt/ZlPXPkkv1C1VosJnOIMF3Q522wRH\nbqaxARldS12VAa3gcWisDWD+SqSyDxjyojz0XDiJkTrFuCTCUiZO+1GLB7SO10Ms\nd5YVX0c90VMnUhF/dlrqS9U=\n-----END CERTIFICATE-----\n"
             );
  testing::AssertionResult::AssertionResult<std::unique_ptr<x509_st,bssl::internal::Deleter>>
            ((AssertionResult *)local_28,
             (unique_ptr<x509_st,_bssl::internal::Deleter> *)&gtest_ar_.message_,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_28);
  if (!bVar1) {
    testing::Message::Message(local_40);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_68,(internal *)local_28,(AssertionResult *)0x8b3006,"false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
               ,0xceb,pcVar2);
    testing::internal::AssertHelper::operator=(&local_48,local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    std::__cxx11::string::~string((string *)&local_68);
    testing::Message::~Message(local_40);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_28);
  if (bVar1) {
    CertFromPEM((anon_unknown_dwarf_52317d *)&gtest_ar__1.message_,
                "\n-----BEGIN CERTIFICATE-----\nMIICDjCCAXegAwIBAgIBAjANBgkqhkiG9w0BAQsFADArMRcwFQYDVQQKEw5Cb3Jp\nbmdTU0wgVGVzdDEQMA4GA1UEAxMHUm9vdCBDQTAgFw0wMDAxMDEwMDAwMDBaGA8y\nMDk5MDEwMTAwMDAwMFowKDEmMCQGA1UEAxMdTmFtZSBDb25zdHJhaW50cyBJbnRl\ncm1lZGlhdGUwWTATBgcqhkjOPQIBBggqhkjOPQMBBwNCAASbbbWYiN6mn+BCpg4X\nNpibOH0D/DN4kZ5C/Ml2YVomC9T83OKk2CzB8fPAabPb4P4Vv+fIabpEfjWS5nzK\nLY1yo4GJMIGGMA8GA1UdEwEB/wQFMAMBAf8wGwYDVR0jBBQwEoAQQDfXAftAL7gc\nflQEJ4xZATBWBgNVHR4BAf8ETDBKoCowEYIPcGVybWl0dGVkMS50ZXN0MBWCE2Zv\nby5wZXJtaXR0ZWQyLnRlc3ShHDAaghhleGNsdWRlZC5wZXJtaXR0ZWQxLnRlc3Qw\nDQYJKoZIhvcNAQELBQADgYEAFq1Ka05hiKREwRpSceQPzIIH4B5a5IVBg5/EvmQI\n9V0fXyAE1GmahPt70sIBxIgzNTEaY8P/IoOuCdlZWe0msmyEO3S6YSAzOWR5Van6\ncXmFM1uMd95TlkxUMRdV+jKJTvG6R/BM2zltaV7Xt662k5HtzT5Svw0rZlFaggZz\nUyM=\n-----END CERTIFICATE-----\n"
               );
    testing::AssertionResult::AssertionResult<std::unique_ptr<x509_st,bssl::internal::Deleter>>
              ((AssertionResult *)local_88,
               (unique_ptr<x509_st,_bssl::internal::Deleter> *)&gtest_ar__1.message_,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_88);
    if (!bVar1) {
      testing::Message::Message(&local_90);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&permitted,(internal *)local_88,(AssertionResult *)0x890406,"false",
                 "true",in_R9);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_98,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                 ,0xced,pcVar2);
      testing::internal::AssertHelper::operator=(&local_98,&local_90);
      testing::internal::AssertHelper::~AssertHelper(&local_98);
      std::__cxx11::string::~string((string *)&permitted);
      testing::Message::~Message(&local_90);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_88);
    if (bVar1) {
      CertFromPEM((anon_unknown_dwarf_52317d *)&gtest_ar__2.message_,
                  "\n-----BEGIN CERTIFICATE-----\nMIIBaDCCAQ2gAwIBAgIBAzAKBggqhkjOPQQDAjAoMSYwJAYDVQQDEx1OYW1lIENv\nbnN0cmFpbnRzIEludGVybWVkaWF0ZTAgFw0wMDAxMDEwMDAwMDBaGA8yMDk5MDEw\nMTAwMDAwMFowPjEeMBwGA1UEChMVQ29tbW9uIG5hbWUgcGVybWl0dGVkMRwwGgYD\nVQQDExNmb28ucGVybWl0dGVkMS50ZXN0MFkwEwYHKoZIzj0CAQYIKoZIzj0DAQcD\nQgAENX5Ycs8q8MRzPYUz6DqLHhJR3wcmniFRgkiEa7MxE/mRe00y0VGwH7xi7Aoc\nemXPrtD4JwN5bssbcxWGAKYYzaMQMA4wDAYDVR0TAQH/BAIwADAKBggqhkjOPQQD\nAgNJADBGAiEAtsnWuRQXtw2xbieC78Y8SVEtTjcZUx8uZyQe1GPLfGICIQDR4fNY\nyg3PC94ydPNQZVsFxAne32CbonWWsokalTFpUQ==\n-----END CERTIFICATE-----\n"
                 );
      testing::AssertionResult::AssertionResult<std::unique_ptr<x509_st,bssl::internal::Deleter>>
                ((AssertionResult *)local_d0,
                 (unique_ptr<x509_st,_bssl::internal::Deleter> *)&gtest_ar__2.message_,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d0);
      if (!bVar1) {
        testing::Message::Message(&local_d8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&not_permitted,(internal *)local_d0,(AssertionResult *)0x890010,"false"
                   ,"true",in_R9);
        pcVar2 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_e0,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                   ,0xcef,pcVar2);
        testing::internal::AssertHelper::operator=(&local_e0,&local_d8);
        testing::internal::AssertHelper::~AssertHelper(&local_e0);
        std::__cxx11::string::~string((string *)&not_permitted);
        testing::Message::~Message(&local_d8);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_d0);
      if (bVar1) {
        CertFromPEM((anon_unknown_dwarf_52317d *)&gtest_ar__3.message_,
                    "\n-----BEGIN CERTIFICATE-----\nMIIBazCCARCgAwIBAgIBBDAKBggqhkjOPQQDAjAoMSYwJAYDVQQDEx1OYW1lIENv\nbnN0cmFpbnRzIEludGVybWVkaWF0ZTAgFw0wMDAxMDEwMDAwMDBaGA8yMDk5MDEw\nMTAwMDAwMFowQTEiMCAGA1UEChMZQ29tbW9uIG5hbWUgbm90IHBlcm1pdHRlZDEb\nMBkGA1UEAxMSbm90LXBlcm1pdHRlZC50ZXN0MFkwEwYHKoZIzj0CAQYIKoZIzj0D\nAQcDQgAEzfghKuWf0JoXb0Drp09C3yXMSQQ1byt+AUaymvsHOWsxQ9v1Q+vkF/IM\nHRqGTk2TyxrB2iClVEn/Uu+YtYox1KMQMA4wDAYDVR0TAQH/BAIwADAKBggqhkjO\nPQQDAgNJADBGAiEAxaUslxmoWL1tIvnDz7gDkto/HcmdU0jHVuUQLXcCG8wCIQCN\n5xZjitlCQU8UB5qSu9wH4B+0JcVO3Ss4Az76HEJWMw==\n-----END CERTIFICATE-----\n"
                   );
        testing::AssertionResult::AssertionResult<std::unique_ptr<x509_st,bssl::internal::Deleter>>
                  ((AssertionResult *)local_118,
                   (unique_ptr<x509_st,_bssl::internal::Deleter> *)&gtest_ar__3.message_,(type *)0x0
                  );
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_118);
        if (!bVar1) {
          testing::Message::Message(&local_120);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&not_permitted_with_sans,(internal *)local_118,
                     (AssertionResult *)"not_permitted","false","true",in_R9);
          pcVar2 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_128,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                     ,0xcf2,pcVar2);
          testing::internal::AssertHelper::operator=(&local_128,&local_120);
          testing::internal::AssertHelper::~AssertHelper(&local_128);
          std::__cxx11::string::~string((string *)&not_permitted_with_sans);
          testing::Message::~Message(&local_120);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_118);
        if (bVar1) {
          CertFromPEM((anon_unknown_dwarf_52317d *)&gtest_ar__4.message_,
                      "\n-----BEGIN CERTIFICATE-----\nMIIBqTCCAU+gAwIBAgIBBjAKBggqhkjOPQQDAjAoMSYwJAYDVQQDEx1OYW1lIENv\nbnN0cmFpbnRzIEludGVybWVkaWF0ZTAgFw0wMDAxMDEwMDAwMDBaGA8yMDk5MDEw\nMTAwMDAwMFowSzEsMCoGA1UEChMjQ29tbW9uIG5hbWUgbm90IHBlcm1pdHRlZCB3\naXRoIFNBTlMxGzAZBgNVBAMTEm5vdC1wZXJtaXR0ZWQudGVzdDBZMBMGByqGSM49\nAgEGCCqGSM49AwEHA0IABKsn9wOApXFHrqhLdQgbFSeaSoAIbxgO0zVSRZUb5naR\n93zoL3MFOvZEF8xiEqh7le+l3XuUig0fwqpcsZzRNJajRTBDMAwGA1UdEwEB/wQC\nMAAwMwYDVR0RBCwwKoITZm9vLnBlcm1pdHRlZDEudGVzdIITZm9vLnBlcm1pdHRl\nZDIudGVzdDAKBggqhkjOPQQDAgNIADBFAiACk+1f184KkKAXuntmrz+Ygcq8MiZl\n4delx44FtcNaegIhAIA5nYfzxNcTXxDo3U+x1vSLH6Y7faLvHiFySp7O//q+\n-----END CERTIFICATE-----\n"
                     );
          testing::AssertionResult::
          AssertionResult<std::unique_ptr<x509_st,bssl::internal::Deleter>>
                    ((AssertionResult *)local_160,
                     (unique_ptr<x509_st,_bssl::internal::Deleter> *)&gtest_ar__4.message_,
                     (type *)0x0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_160);
          if (!bVar1) {
            testing::Message::Message(&local_168);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&not_dns,(internal *)local_160,
                       (AssertionResult *)"not_permitted_with_sans","false","true",in_R9);
            pcVar2 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_170,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                       ,0xcf5,pcVar2);
            testing::internal::AssertHelper::operator=(&local_170,&local_168);
            testing::internal::AssertHelper::~AssertHelper(&local_170);
            std::__cxx11::string::~string((string *)&not_dns);
            testing::Message::~Message(&local_168);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_160);
          if (bVar1) {
            CertFromPEM((anon_unknown_dwarf_52317d *)&gtest_ar__5.message_,
                        "\n-----BEGIN CERTIFICATE-----\nMIIBYTCCAQagAwIBAgIBCDAKBggqhkjOPQQDAjAoMSYwJAYDVQQDEx1OYW1lIENv\nbnN0cmFpbnRzIEludGVybWVkaWF0ZTAgFw0wMDAxMDEwMDAwMDBaGA8yMDk5MDEw\nMTAwMDAwMFowNzEcMBoGA1UEChMTQ29tbW9uIG5hbWUgbm90IEROUzEXMBUGA1UE\nAxMOTm90IGEgRE5TIG5hbWUwWTATBgcqhkjOPQIBBggqhkjOPQMBBwNCAASnueyc\nZxtnw5ke2J2T0/LwAK37auQP/RSFd9mem+BJVbgviawtAlignJmafp7Zw4/GdYEJ\nVm8qlriOJtluvXGcoxAwDjAMBgNVHRMBAf8EAjAAMAoGCCqGSM49BAMCA0kAMEYC\nIQChUAmVNI39VHe0zemRE09VDcSEgOxr1nTvjLcg/Q8pVQIhAJYZnJI0YZAi05QH\nRHNlAkTK2TnUaVn3fGSylaLiFS1r\n-----END CERTIFICATE-----\n"
                       );
            testing::AssertionResult::
            AssertionResult<std::unique_ptr<x509_st,bssl::internal::Deleter>>
                      ((AssertionResult *)local_1a8,
                       (unique_ptr<x509_st,_bssl::internal::Deleter> *)&gtest_ar__5.message_,
                       (type *)0x0);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a8);
            if (!bVar1) {
              testing::Message::Message(&local_1b0);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&verify_cert.intermediate,(internal *)local_1a8,
                         (AssertionResult *)"not_dns","false","true",in_R9);
              pcVar2 = (char *)std::__cxx11::string::c_str();
              testing::internal::AssertHelper::AssertHelper
                        (&local_1b8,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                         ,0xcf7,pcVar2);
              testing::internal::AssertHelper::operator=(&local_1b8,&local_1b0);
              testing::internal::AssertHelper::~AssertHelper(&local_1b8);
              std::__cxx11::string::~string((string *)&verify_cert.intermediate);
              testing::Message::~Message(&local_1b0);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a8);
            if (bVar1) {
              gtest_ar.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl =
                   (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )&gtest_ar_.message_;
              verify_cert.root = (UniquePtr<X509> *)&gtest_ar__1.message_;
              local_200[1] = 0x43;
              pxVar3 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                 ((unique_ptr<x509_st,_bssl::internal::Deleter> *)
                                  &gtest_ar__2.message_);
              local_200[0] = TestBody::anon_class_16_2_a4d0f9f0::operator()
                                       ((anon_class_16_2_a4d0f9f0 *)&gtest_ar.message_,pxVar3,0,
                                        "foo.permitted1.test");
              testing::internal::EqHelper::Compare<int,_int,_nullptr>
                        ((EqHelper *)local_1f8,"67",
                         "verify_cert(permitted.get(), 0 , kCommonNamePermitted)",local_200 + 1,
                         local_200);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f8);
              if (!bVar1) {
                testing::Message::Message(&local_208);
                pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1f8);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                           ,0xd08,pcVar2);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&gtest_ar_1.message_,&local_208);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_)
                ;
                testing::Message::~Message(&local_208);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f8);
              local_228[1] = 0x43;
              pxVar3 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                 ((unique_ptr<x509_st,_bssl::internal::Deleter> *)
                                  &gtest_ar__3.message_);
              local_228[0] = TestBody::anon_class_16_2_a4d0f9f0::operator()
                                       ((anon_class_16_2_a4d0f9f0 *)&gtest_ar.message_,pxVar3,0,
                                        "not-permitted.test");
              testing::internal::EqHelper::Compare<int,_int,_nullptr>
                        ((EqHelper *)local_220,"67",
                         "verify_cert(not_permitted.get(), 0 , kCommonNameNotPermitted)",
                         local_228 + 1,local_228);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_220);
              if (!bVar1) {
                testing::Message::Message(&local_230);
                pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_220);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                           ,0xd0b,pcVar2);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&gtest_ar_2.message_,&local_230);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_)
                ;
                testing::Message::~Message(&local_230);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_220);
              local_250[1] = 0x43;
              pxVar3 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                 ((unique_ptr<x509_st,_bssl::internal::Deleter> *)
                                  &gtest_ar__3.message_);
              local_280 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                    ((unique_ptr<x509_st,_bssl::internal::Deleter> *)
                                     &gtest_ar_.message_);
              local_278 = &local_280;
              local_270 = 1;
              std::allocator<x509_st_*>::allocator(&local_281);
              __l_04._M_len = local_270;
              __l_04._M_array = local_278;
              std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                        (&local_268,__l_04,&local_281);
              local_2b8 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                    ((unique_ptr<x509_st,_bssl::internal::Deleter> *)
                                     &gtest_ar__1.message_);
              local_2b0 = &local_2b8;
              local_2a8 = 1;
              std::allocator<x509_st_*>::allocator(&local_2b9);
              __l_03._M_len = local_2a8;
              __l_03._M_array = local_2b0;
              std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                        (&local_2a0,__l_03,&local_2b9);
              local_2d8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              local_2d8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              local_2d8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              std::vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>::vector(&local_2d8);
              std::function<void_(x509_store_ctx_st_*)>::function(&local_2f8,(nullptr_t)0x0);
              local_250[0] = Verify(pxVar3,&local_268,&local_2a0,&local_2d8,0,&local_2f8);
              testing::internal::EqHelper::Compare<int,_int,_nullptr>
                        ((EqHelper *)local_248,"67",
                         "Verify(not_permitted.get(), {root.get()}, {intermediate.get()}, {}, 0 , nullptr)"
                         ,local_250 + 1,local_250);
              std::function<void_(x509_store_ctx_st_*)>::~function(&local_2f8);
              std::vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>::~vector(&local_2d8);
              std::vector<x509_st_*,_std::allocator<x509_st_*>_>::~vector(&local_2a0);
              std::allocator<x509_st_*>::~allocator(&local_2b9);
              std::vector<x509_st_*,_std::allocator<x509_st_*>_>::~vector(&local_268);
              std::allocator<x509_st_*>::~allocator(&local_281);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_248);
              if (!bVar1) {
                testing::Message::Message(&local_300);
                pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_248);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                           ,0xd11,pcVar2);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&gtest_ar_3.message_,&local_300);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_)
                ;
                testing::Message::~Message(&local_300);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_248);
              local_320[1] = 0;
              pxVar3 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                 ((unique_ptr<x509_st,_bssl::internal::Deleter> *)
                                  &gtest_ar__4.message_);
              local_350 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                    ((unique_ptr<x509_st,_bssl::internal::Deleter> *)
                                     &gtest_ar_.message_);
              local_348 = &local_350;
              local_340 = 1;
              std::allocator<x509_st_*>::allocator(&local_351);
              __l_02._M_len = local_340;
              __l_02._M_array = local_348;
              std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                        (&local_338,__l_02,&local_351);
              local_388 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                    ((unique_ptr<x509_st,_bssl::internal::Deleter> *)
                                     &gtest_ar__1.message_);
              local_380 = &local_388;
              local_378 = 1;
              std::allocator<x509_st_*>::allocator(&local_389);
              __l_01._M_len = local_378;
              __l_01._M_array = local_380;
              std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                        (&local_370,__l_01,&local_389);
              local_3a8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              local_3a8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              local_3a8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              std::vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>::vector(&local_3a8);
              std::function<void_(x509_store_ctx_st_*)>::function(&local_3c8,(nullptr_t)0x0);
              local_320[0] = Verify(pxVar3,&local_338,&local_370,&local_3a8,0,&local_3c8);
              testing::internal::EqHelper::Compare<int,_int,_nullptr>
                        ((EqHelper *)local_318,"0",
                         "Verify(not_permitted_with_sans.get(), {root.get()}, {intermediate.get()}, {}, 0, nullptr)"
                         ,local_320 + 1,local_320);
              std::function<void_(x509_store_ctx_st_*)>::~function(&local_3c8);
              std::vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>::~vector(&local_3a8);
              std::vector<x509_st_*,_std::allocator<x509_st_*>_>::~vector(&local_370);
              std::allocator<x509_st_*>::~allocator(&local_389);
              std::vector<x509_st_*,_std::allocator<x509_st_*>_>::~vector(&local_338);
              std::allocator<x509_st_*>::~allocator(&local_351);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_318);
              if (!bVar1) {
                testing::Message::Message(&local_3d0);
                pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_318);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                           ,0xd16,pcVar2);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&gtest_ar_4.message_,&local_3d0);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_)
                ;
                testing::Message::~Message(&local_3d0);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_318);
              local_3f0[1] = 0x3e;
              pxVar3 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                 ((unique_ptr<x509_st,_bssl::internal::Deleter> *)
                                  &gtest_ar__4.message_);
              local_3f0[0] = TestBody::anon_class_16_2_a4d0f9f0::operator()
                                       ((anon_class_16_2_a4d0f9f0 *)&gtest_ar.message_,pxVar3,0,
                                        "not-permitted.test");
              testing::internal::EqHelper::Compare<int,_int,_nullptr>
                        ((EqHelper *)local_3e8,"62",
                         "verify_cert(not_permitted_with_sans.get(), 0 , kCommonNameNotPermittedWithSANs)"
                         ,local_3f0 + 1,local_3f0);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3e8);
              if (!bVar1) {
                testing::Message::Message(&local_3f8);
                pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_3e8);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                           ,0xd19,pcVar2);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&gtest_ar_5.message_,&local_3f8);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_)
                ;
                testing::Message::~Message(&local_3f8);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_3e8);
              local_418[1] = 0;
              pxVar3 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                 ((unique_ptr<x509_st,_bssl::internal::Deleter> *)
                                  &gtest_ar__5.message_);
              local_448 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                    ((unique_ptr<x509_st,_bssl::internal::Deleter> *)
                                     &gtest_ar_.message_);
              local_440 = &local_448;
              local_438 = 1;
              std::allocator<x509_st_*>::allocator(&local_449);
              __l_00._M_len = local_438;
              __l_00._M_array = local_440;
              std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                        (&local_430,__l_00,&local_449);
              local_480 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                    ((unique_ptr<x509_st,_bssl::internal::Deleter> *)
                                     &gtest_ar__1.message_);
              local_478 = &local_480;
              local_470 = 1;
              std::allocator<x509_st_*>::allocator(&local_481);
              __l._M_len = local_470;
              __l._M_array = local_478;
              std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector(&local_468,__l,&local_481);
              local_4a8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              local_4a8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              local_4a8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              std::vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>::vector(&local_4a8);
              std::function<void_(x509_store_ctx_st_*)>::function(&local_4c8,(nullptr_t)0x0);
              local_418[0] = Verify(pxVar3,&local_430,&local_468,&local_4a8,0,&local_4c8);
              testing::internal::EqHelper::Compare<int,_int,_nullptr>
                        ((EqHelper *)local_410,"0",
                         "Verify(not_dns.get(), {root.get()}, {intermediate.get()}, {}, 0, nullptr)"
                         ,local_418 + 1,local_418);
              std::function<void_(x509_store_ctx_st_*)>::~function(&local_4c8);
              std::vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>::~vector(&local_4a8);
              std::vector<x509_st_*,_std::allocator<x509_st_*>_>::~vector(&local_468);
              std::allocator<x509_st_*>::~allocator(&local_481);
              std::vector<x509_st_*,_std::allocator<x509_st_*>_>::~vector(&local_430);
              std::allocator<x509_st_*>::~allocator(&local_449);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_410);
              if (!bVar1) {
                testing::Message::Message(&local_4d0);
                pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_410);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                           ,0xd1e,pcVar2);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&gtest_ar_6.message_,&local_4d0);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_)
                ;
                testing::Message::~Message(&local_4d0);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_410);
              local_4f0[1] = 0x3e;
              pxVar3 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                 ((unique_ptr<x509_st,_bssl::internal::Deleter> *)
                                  &gtest_ar__5.message_);
              local_4f0[0] = TestBody::anon_class_16_2_a4d0f9f0::operator()
                                       ((anon_class_16_2_a4d0f9f0 *)&gtest_ar.message_,pxVar3,0,
                                        "Not a DNS name");
              testing::internal::EqHelper::Compare<int,_int,_nullptr>
                        ((EqHelper *)local_4e8,"62",
                         "verify_cert(not_dns.get(), 0 , kCommonNameNotDNS)",local_4f0 + 1,local_4f0
                        );
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4e8);
              if (!bVar1) {
                testing::Message::Message(&local_4f8);
                pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_4e8);
                testing::internal::AssertHelper::AssertHelper
                          (&local_500,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                           ,0xd20,pcVar2);
                testing::internal::AssertHelper::operator=(&local_500,&local_4f8);
                testing::internal::AssertHelper::~AssertHelper(&local_500);
                testing::Message::~Message(&local_4f8);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_4e8);
            }
            std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr
                      ((unique_ptr<x509_st,_bssl::internal::Deleter> *)&gtest_ar__5.message_);
          }
          std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr
                    ((unique_ptr<x509_st,_bssl::internal::Deleter> *)&gtest_ar__4.message_);
        }
        std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr
                  ((unique_ptr<x509_st,_bssl::internal::Deleter> *)&gtest_ar__3.message_);
      }
      std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<x509_st,_bssl::internal::Deleter> *)&gtest_ar__2.message_);
    }
    std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<x509_st,_bssl::internal::Deleter> *)&gtest_ar__1.message_);
  }
  std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<x509_st,_bssl::internal::Deleter> *)&gtest_ar_.message_);
  return;
}

Assistant:

TEST(X509Test, CommonNameAndNameConstraints) {
  bssl::UniquePtr<X509> root = CertFromPEM(kSANTypesRoot);
  ASSERT_TRUE(root);
  bssl::UniquePtr<X509> intermediate = CertFromPEM(kConstrainedIntermediate);
  ASSERT_TRUE(intermediate);
  bssl::UniquePtr<X509> permitted = CertFromPEM(kCommonNamePermittedLeaf);
  ASSERT_TRUE(permitted);
  bssl::UniquePtr<X509> not_permitted =
      CertFromPEM(kCommonNameNotPermittedLeaf);
  ASSERT_TRUE(not_permitted);
  bssl::UniquePtr<X509> not_permitted_with_sans =
      CertFromPEM(kCommonNameNotPermittedWithSANsLeaf);
  ASSERT_TRUE(not_permitted_with_sans);
  bssl::UniquePtr<X509> not_dns = CertFromPEM(kCommonNameNotDNSLeaf);
  ASSERT_TRUE(not_dns);

  auto verify_cert = [&](X509 *leaf, unsigned flags, const char *host) {
    return Verify(
        leaf, {root.get()}, {intermediate.get()}, {}, 0,
        [&](X509_STORE_CTX *ctx) {
          X509_VERIFY_PARAM *param = X509_STORE_CTX_get0_param(ctx);
          ASSERT_TRUE(X509_VERIFY_PARAM_set1_host(param, host, strlen(host)));
          X509_VERIFY_PARAM_set_hostflags(param, flags);
        });
  };

  // Certificates which would otherwise trigger the common name fallback are
  // rejected whenever there are name constraints. We do this whether or not
  // the common name matches the constraints.
  EXPECT_EQ(
      X509_V_ERR_NAME_CONSTRAINTS_WITHOUT_SANS,
      verify_cert(permitted.get(), 0 /* no flags */, kCommonNamePermitted));
  EXPECT_EQ(X509_V_ERR_NAME_CONSTRAINTS_WITHOUT_SANS,
            verify_cert(not_permitted.get(), 0 /* no flags */,
                        kCommonNameNotPermitted));

  // This occurs even if the built-in name checks aren't used. The caller may
  // separately call |X509_check_host|.
  EXPECT_EQ(X509_V_ERR_NAME_CONSTRAINTS_WITHOUT_SANS,
            Verify(not_permitted.get(), {root.get()}, {intermediate.get()}, {},
                   0 /* no flags */, nullptr));

  // If the leaf certificate has SANs, the common name fallback is always
  // disabled, so the name constraints do not apply.
  EXPECT_EQ(X509_V_OK, Verify(not_permitted_with_sans.get(), {root.get()},
                              {intermediate.get()}, {}, 0, nullptr));
  EXPECT_EQ(X509_V_ERR_HOSTNAME_MISMATCH,
            verify_cert(not_permitted_with_sans.get(), 0 /* no flags */,
                        kCommonNameNotPermittedWithSANs));

  // If the common name does not look like a DNS name, we apply neither name
  // constraints nor common name fallback.
  EXPECT_EQ(X509_V_OK, Verify(not_dns.get(), {root.get()}, {intermediate.get()},
                              {}, 0, nullptr));
  EXPECT_EQ(X509_V_ERR_HOSTNAME_MISMATCH,
            verify_cert(not_dns.get(), 0 /* no flags */, kCommonNameNotDNS));
}